

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_log.c
# Opt level: O0

zt_log_level zt_log_set_level(zt_log_ty *log,zt_log_level level)

{
  zt_log_level zVar1;
  zt_log_level in_ESI;
  zt_log_ty *in_RDI;
  zt_log_level olevel;
  zt_log_ty *local_10;
  
  local_10 = in_RDI;
  if ((in_RDI == (zt_log_ty *)0x0) && (local_10 = zt_log_get_logger(), local_10 == (zt_log_ty *)0x0)
     ) {
    return zt_log_emerg;
  }
  zVar1 = local_10->level;
  local_10->level = in_ESI;
  return zVar1;
}

Assistant:

zt_log_level
zt_log_set_level(zt_log_ty * log, zt_log_level level) {
    zt_log_level olevel;

    if (!log && ((log = zt_log_get_logger()) == NULL)) {
        return 0;
    }

    olevel     = log->level;
    log->level = level;
    return olevel;
}